

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O3

void queue_declare(amqp_connection_state_t connection_state_,char *queue_name_)

{
  amqp_queue_declare_ok_t *paVar1;
  amqp_bytes_t queue;
  
  queue = amqp_cstring_bytes(queue_name_);
  paVar1 = amqp_queue_declare(connection_state_,1,queue,0,0,0,1,(amqp_table_t)ZEXT816((ulong)0));
  if (paVar1 != (amqp_queue_declare_ok_t *)0x0) {
    return;
  }
  __assert_fail("res != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                ,0x56,"void queue_declare(amqp_connection_state_t, const char *)");
}

Assistant:

void queue_declare(amqp_connection_state_t connection_state_,
                   const char *queue_name_) {
  amqp_queue_declare_ok_t *res = amqp_queue_declare(
      connection_state_, fixed_channel_id, amqp_cstring_bytes(queue_name_),
      /*passive*/ 0,
      /*durable*/ 0,
      /*exclusive*/ 0,
      /*auto_delete*/ 1, amqp_empty_table);
  assert(res != NULL);
}